

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManPrintInit(Nf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int nChoices;
  Nf_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)p->pPars->nRounds);
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    printf("Cells = %d  ",(ulong)(uint)p->nCells);
    uVar1 = Vec_MemEntryNum(p->vTtMem);
    printf("Funcs = %d  ",(ulong)uVar1);
    iVar2 = Vec_WecSizeSize(p->vTt2Match);
    printf("Matches = %d  ",(long)iVar2 / 2 & 0xffffffff,(long)iVar2 % 2 & 0xffffffff);
    uVar1 = Gia_ManAndNum(p->pGia);
    printf("And = %d  ",(ulong)uVar1);
    uVar1 = Gia_ManChoiceNum(p->pGia);
    if (uVar1 != 0) {
      printf("Choices = %d  ",(ulong)uVar1);
    }
    printf("\n");
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Nf_ManPrintInit( Nf_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds );//+ p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    printf( "Cells = %d  ",   p->nCells );
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    printf( "Matches = %d  ", Vec_WecSizeSize(p->vTt2Match)/2 );
    printf( "And = %d  ",     Gia_ManAndNum(p->pGia) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}